

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::async_write_handler::operator()
          (async_write_handler *this,error_code *ein)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  callback *c;
  error_code *in_RSI;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_RDI;
  size_t n;
  error_code e;
  error_code *in_stack_ffffffffffffffa0;
  callback<void_(const_std::error_code_&)> *this_00;
  element_type *in_stack_ffffffffffffffa8;
  error_code *in_stack_ffffffffffffffb8;
  callback<void_(const_std::error_code_&)> *in_stack_ffffffffffffffc0;
  callback<void_(const_std::error_code_&)> in_stack_ffffffffffffffc8;
  const_buffer *in_stack_ffffffffffffffd0;
  error_code local_20 [2];
  undefined4 extraout_var_00;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    std::error_code::error_code(in_stack_ffffffffffffffa0);
    peVar3 = std::
             __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x389998);
    iVar2 = (*peVar3->_vptr_connection[0xe])();
    booster::aio::basic_io_device::set_non_blocking_if_needed(SUB41(iVar2,0),(error_code *)0x1);
    peVar3 = std::
             __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3899c1);
    iVar2 = (*peVar3->_vptr_connection[0xe])();
    lVar4 = booster::aio::stream_socket::write_some
                      ((const_buffer *)CONCAT44(extraout_var,iVar2),(error_code *)(in_RDI + 5));
    booster::aio::operator+=
              (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8.call_ptr.p_);
    if (lVar4 != 0) {
      in_stack_ffffffffffffffa8 =
           std::
           __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x389a0e);
      bVar1 = booster::aio::buffer_impl<const_char_*>::empty
                        ((buffer_impl<const_char_*> *)(in_RDI + 5));
      (*in_stack_ffffffffffffffa8->_vptr_connection[8])(in_stack_ffffffffffffffa8,(ulong)bVar1);
    }
    bVar1 = booster::aio::buffer_impl<const_char_*>::empty
                      ((buffer_impl<const_char_*> *)(in_RDI + 5));
    if (bVar1) {
      booster::callback<void_(const_std::error_code_&)>::operator()
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if ((bVar1) &&
         (uVar5 = booster::aio::basic_io_device::would_block(local_20), (uVar5 & 1) == 0)) {
        booster::callback<void_(const_std::error_code_&)>::operator()
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x389aa4);
        iVar2 = (*peVar3->_vptr_connection[0xe])();
        c = (callback *)CONCAT44(extraout_var_00,iVar2);
        this_00 = (callback<void_(const_std::error_code_&)> *)&stack0xffffffffffffffc8;
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
                  (in_RDI,(callable<void_(const_std::error_code_&)> *)in_stack_ffffffffffffffa8,
                   SUB81((ulong)this_00 >> 0x38,0));
        booster::callback<void(std::error_code_const&)>::
        callback<booster::callable<void(std::error_code_const&)>>
                  (this_00,(intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)c);
        booster::aio::basic_io_device::on_writeable(c);
        booster::callback<void_(const_std::error_code_&)>::~callback
                  ((callback<void_(const_std::error_code_&)> *)0x389af8);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&this_00->call_ptr);
      }
    }
  }
  return;
}

Assistant:

virtual void operator()(booster::system::error_code const &ein)
	{
		if(ein) { h(ein); return; }
		booster::system::error_code e;
		conn->socket().set_non_blocking_if_needed(true,e);
		size_t n = conn->socket().write_some(output,e);
		output += n;
		if(n!=0) {
			conn->on_async_write_progress(output.empty());
		}
		if(output.empty()) {
			h(e);
			return;
		}
		if(e && !booster::aio::basic_io_device::would_block(e)) {
			h(e);
			return;
		}
		conn->socket().on_writeable(self_type(this));
	}